

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void C_NewModeAdjust(void)

{
  long lVar1;
  
  C_InitConsole((screen->super_DSimpleCanvas).super_DCanvas.Width,
                (screen->super_DSimpleCanvas).super_DCanvas.Height,true);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)&NotifyStrings[0].TimeOut + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x40);
  C_AdjustBottom();
  return;
}

Assistant:

void C_NewModeAdjust ()
{
	C_InitConsole (SCREENWIDTH, SCREENHEIGHT, true);
	C_FlushDisplay ();
	C_AdjustBottom ();
}